

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

SuperVars * __thiscall
jsonnet::internal::Desugarer::desugarFields
          (SuperVars *__return_storage_ptr__,Desugarer *this,AST *ast,ObjectFields *fields,
          uint obj_level)

{
  LocationRange *args;
  Kind KVar1;
  AST *pAVar2;
  LiteralString *pLVar3;
  Conditional *pCVar4;
  Function *pFVar5;
  Local *pLVar6;
  pointer pOVar7;
  AST **ppAVar8;
  uint obj_level_00;
  pointer pOVar9;
  ArgParams *args_3;
  SuperVars *super_vars;
  Binds binds;
  AST *index;
  ObjectFields copy;
  BinaryOp local_150;
  undefined1 local_14c [4];
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> local_148;
  AST *local_130;
  vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_> local_128;
  pointer local_110;
  AST *local_108;
  void *local_100;
  AST *local_f8;
  SuperIndex *local_f0;
  Binary *local_e8;
  undefined1 local_e0 [32];
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_c0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_98;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_80;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_60;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_48;
  
  pOVar9 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pOVar7 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar9 != pOVar7) {
    obj_level_00 = obj_level + 1;
    ppAVar8 = &pOVar9->expr3;
    do {
      if (ppAVar8[-0x12] != (AST *)0x0) {
        desugar(this,ppAVar8 + -0x12,obj_level);
      }
      desugar(this,ppAVar8 + -1,obj_level_00);
      if (*ppAVar8 != (AST *)0x0) {
        desugar(this,ppAVar8,obj_level_00);
      }
      desugarParams(this,(ArgParams *)(ppAVar8 + -8),obj_level_00);
      pOVar9 = (pointer)(ppAVar8 + 4);
      ppAVar8 = ppAVar8 + 0x24;
    } while (pOVar9 != pOVar7);
    pOVar9 = (fields->
             super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pOVar7 = (fields->
             super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pOVar9 != pOVar7) {
      ppAVar8 = &pOVar9->expr2;
      do {
        if (((ObjectField *)(ppAVar8 + -0x1f))->kind == ASSERT) {
          pLVar3 = (LiteralString *)ppAVar8[1];
          ppAVar8[1] = (AST *)0x0;
          if (pLVar3 == (LiteralString *)0x0) {
            pAVar2 = *ppAVar8;
            local_e0._0_8_ = local_e0 + 0x10;
            ::std::__cxx11::u32string::_M_construct<char32_t_const*>
                      ((u32string *)local_e0,L"Object assertion failed.",L"");
            local_128.
            super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_128.
                                   super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,5);
            pLVar3 = Allocator::
                     make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                               (this->alloc,&pAVar2->location,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                                       *)local_e0,(TokenKind *)&local_128,(char (*) [1])0x20bb47,
                                (char (*) [1])0x20bb47);
            if ((InSuper *)local_e0._0_8_ != (InSuper *)(local_e0 + 0x10)) {
              operator_delete((void *)local_e0._0_8_,local_e0._16_8_ * 4 + 4);
            }
          }
          pAVar2 = *ppAVar8;
          local_148.
          super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_148.
                                 super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
          local_128.
          super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)Allocator::
                        make<jsonnet::internal::LiteralBoolean,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                                  (this->alloc,(LocationRange *)E,
                                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                    *)EF,(bool *)&local_148);
          local_e0._0_8_ = pLVar3;
          local_e0._0_8_ =
               Allocator::
               make<jsonnet::internal::Error,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&>
                         (this->alloc,&(pLVar3->super_AST).location,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(AST **)local_e0);
          pCVar4 = Allocator::
                   make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::LiteralBoolean*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Error*>
                             (this->alloc,&pAVar2->location,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,ppAVar8,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,(LiteralBoolean **)&local_128,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,(Error **)local_e0);
          *ppAVar8 = &pCVar4->super_AST;
        }
        pOVar9 = (pointer)(ppAVar8 + 5);
        ppAVar8 = ppAVar8 + 0x24;
      } while (pOVar9 != pOVar7);
      pOVar9 = (fields->
               super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pOVar7 = (fields->
               super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pOVar9 != pOVar7) {
      args_3 = &pOVar9->params;
      do {
        if (*(char *)((long)(args_3 + -4) + 0xd) == '\x01') {
          pFVar5 = Allocator::
                   make<jsonnet::internal::Function,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
                             (this->alloc,(LocationRange *)(*(long *)((long)(args_3 + 2) + 8) + 8),
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                     *)((long)(args_3 + -6) + 8),args_3,(bool *)(args_3 + 1),
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)((long)(args_3 + -5) + 8),(AST **)((long)(args_3 + 2) + 8));
          *(Function **)((long)(args_3 + 2) + 8) = pFVar5;
          *(undefined1 *)((long)(args_3 + -4) + 0xd) = 0;
          ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          _M_erase_at_end(args_3,(args_3->
                                 super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
        }
        pOVar9 = (pointer)(args_3 + 4);
        args_3 = args_3 + 0xc;
      } while (pOVar9 != pOVar7);
    }
  }
  ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  vector(&local_128,fields);
  ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  _M_erase_at_end(fields,(fields->
                         super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  pOVar9 = local_128.
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_148.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_128.
      super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pOVar7 = local_128.
             super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (*(int *)&((AST *)&pOVar7->kind)->_vptr_AST == 4) {
        bind((Desugarer *)local_e0,(int)this,(sockaddr *)pOVar7->id,(socklen_t)pOVar7->expr2);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        emplace_back<jsonnet::internal::Local::Bind>(&local_148,(Bind *)local_e0);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_48);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_60);
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_80);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_98);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_c0);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)local_e0);
      }
      pOVar7 = pOVar7 + 1;
    } while (pOVar7 != pOVar9);
    if (local_128.
        super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_128.
        super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppAVar8 = &(local_128.
                  super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                  ._M_impl.super__Vector_impl_data._M_start)->expr2;
      do {
        if (((ObjectField *)(ppAVar8 + -0x1f))->kind != LOCAL) {
          if (local_148.
              super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_148.
              super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pLVar6 = Allocator::
                     make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                               (this->alloc,&(*ppAVar8)->location,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_148,ppAVar8);
            *ppAVar8 = &pLVar6->super_AST;
          }
          ::std::
          vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
          push_back(fields,(value_type *)(ppAVar8 + -0x1f));
        }
        pOVar9 = (pointer)(ppAVar8 + 5);
        ppAVar8 = ppAVar8 + 0x24;
      } while (pOVar9 != local_128.
                         super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  pOVar9 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pOVar7 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar9 == pOVar7) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    do {
      KVar1 = pOVar9->kind;
      if (KVar1 == FIELD_ID) {
        local_e0._0_4_ = 5;
        pLVar3 = Allocator::
                 make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                           (this->alloc,&pOVar9->idLocation,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&pOVar9->id->name,(TokenKind *)local_e0,(char (*) [1])0x20bb47,
                            (char (*) [1])0x20bb47);
        pOVar9->expr1 = &pLVar3->super_AST;
LAB_001a267c:
        pOVar9->kind = FIELD_EXPR;
      }
      else {
        if (KVar1 == FIELD_STR) goto LAB_001a267c;
        if (KVar1 == LOCAL) {
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&::std::cerr,"Locals should be removed by now.",0x20);
          ::std::endl<char,std::char_traits<char>>((ostream *)&::std::cerr);
          abort();
        }
      }
      pOVar9 = pOVar9 + 1;
    } while (pOVar9 != pOVar7);
    pOVar9 = (fields->
             super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pOVar7 = (fields->
             super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_14c = (undefined1  [4])0x0;
    if (pOVar9 != pOVar7) {
      args = &ast->location;
      ppAVar8 = &pOVar9->expr2;
      local_110 = pOVar7;
      do {
        if (*(bool *)((long)ppAVar8 + -0x8c) == true) {
          local_130 = clone_ast(this->alloc,ppAVar8[-0x11]);
          local_e0._8_8_ = this->alloc;
          local_e0._0_8_ = &PTR_fodderElement_00237a88;
          local_c0.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_14c;
          local_c0.
          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e0._16_8_ = this;
          local_e0._24_8_ = __return_storage_ptr__;
          CompilerPass::expr((CompilerPass *)local_e0,&local_130);
          local_e0._0_8_ =
               Allocator::
               make<jsonnet::internal::InSuper,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                         (this->alloc,args,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_130,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF);
          local_f8 = clone_ast(this->alloc,local_130);
          local_100 = (void *)0x0;
          local_f0 = Allocator::
                     make<jsonnet::internal::SuperIndex,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr)>
                               (this->alloc,args,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                       *)EF,&local_f8,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_100);
          local_150 = BOP_PLUS;
          local_e8 = Allocator::
                     make<jsonnet::internal::Binary,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::SuperIndex*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::BinaryOp,jsonnet::internal::AST*&>
                               (this->alloc,args,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_f0,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_150,ppAVar8);
          local_108 = clone_ast(this->alloc,*ppAVar8);
          pCVar4 = Allocator::
                   make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::InSuper*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Binary*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*>
                             (this->alloc,args,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,(InSuper **)local_e0,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,&local_e8,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)EF,&local_108);
          *ppAVar8 = &pCVar4->super_AST;
          *(bool *)((long)ppAVar8 + -0x8c) = false;
          pOVar7 = local_110;
        }
        pOVar9 = (pointer)(ppAVar8 + 5);
        ppAVar8 = ppAVar8 + 0x24;
      } while (pOVar9 != pOVar7);
    }
  }
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector(&local_148);
  ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
  ~vector(&local_128);
  return __return_storage_ptr__;
}

Assistant:

SuperVars desugarFields(AST *ast, ObjectFields &fields, unsigned obj_level)
    {
        // Desugar children
        for (auto &field : fields) {
            if (field.expr1 != nullptr)
                desugar(field.expr1, obj_level);
            desugar(field.expr2, obj_level + 1);
            if (field.expr3 != nullptr)
                desugar(field.expr3, obj_level + 1);
            desugarParams(field.params, obj_level + 1);
        }

        // Simplify asserts
        for (auto &field : fields) {
            if (field.kind != ObjectField::ASSERT)
                continue;
            AST *msg = field.expr3;
            field.expr3 = nullptr;
            if (msg == nullptr) {
                // The location is what appears in the stacktrace.
                msg = str(field.expr2->location, U"Object assertion failed.");
            }

            // if expr2 then true else error msg
            field.expr2 = make<Conditional>(field.expr2->location,
                                            EF,
                                            field.expr2,
                                            EF,
                                            make<LiteralBoolean>(E, EF, true),
                                            EF,
                                            error(msg));
        }

        // Remove methods
        for (auto &field : fields) {
            if (!field.methodSugar)
                continue;
            field.expr2 = make<Function>(field.expr2->location,
                                         EF,
                                         field.fodderL,
                                         field.params,
                                         field.trailingComma,
                                         field.fodderR,
                                         field.expr2);
            field.methodSugar = false;
            field.params.clear();
        }

        // Remove object-level locals
        auto copy = fields;
        fields.clear();
        Local::Binds binds;
        for (auto &local : copy) {
            if (local.kind != ObjectField::LOCAL)
                continue;
            binds.push_back(bind(local.id, local.expr2));
        }
        for (auto &field : copy) {
            if (field.kind == ObjectField::LOCAL)
                continue;
            if (!binds.empty())
                field.expr2 = make<Local>(field.expr2->location, EF, binds, field.expr2);
            fields.push_back(field);
        }

        // Change all to FIELD_EXPR
        for (auto &field : fields) {
            switch (field.kind) {
                case ObjectField::ASSERT:
                    // Nothing to do.
                    break;

                case ObjectField::FIELD_ID:
                    field.expr1 = str(field.idLocation, field.id->name);
                    field.kind = ObjectField::FIELD_EXPR;
                    break;

                case ObjectField::FIELD_EXPR:
                    // Nothing to do.
                    break;

                case ObjectField::FIELD_STR:
                    // Just set the flag.
                    field.kind = ObjectField::FIELD_EXPR;
                    break;

                case ObjectField::LOCAL:
                    std::cerr << "Locals should be removed by now." << std::endl;
                    abort();
            }
        }

        /** Replaces all occurrences of self, super[f] and e in super with variables.
         *
         * Returns all variables and original expressions via super_vars.
         */
        class SubstituteSelfSuper : public CompilerPass {
            Desugarer *desugarer;
            SuperVars &superVars;
            unsigned &counter;
            const Identifier *newSelf;

           public:
            SubstituteSelfSuper(Desugarer *desugarer, SuperVars &super_vars, unsigned &counter)
                : CompilerPass(*desugarer->alloc),
                  desugarer(desugarer),
                  superVars(super_vars),
                  counter(counter),
                  newSelf(nullptr)
            {
            }
            void visitExpr(AST *&expr)
            {
                if (dynamic_cast<Self *>(expr)) {
                    if (newSelf == nullptr) {
                        newSelf = desugarer->id(U"$outer_self");
                        superVars.emplace_back(newSelf, nullptr);
                    }
                    expr = alloc.make<Var>(expr->location, expr->openFodder, newSelf);
                } else if (auto *super_index = dynamic_cast<SuperIndex *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_super_index" << (counter++);
                    const Identifier *super_var = desugarer->id(ss.str());
                    // Desugaring of expr should already have occurred.
                    assert(super_index->index != nullptr);
                    // Re-use super_index since we're replacing it here.
                    superVars.emplace_back(super_var, super_index);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, super_var);
                } else if (auto *in_super = dynamic_cast<InSuper *>(expr)) {
                    UStringStream ss;
                    ss << U"$outer_in_super" << (counter++);
                    const Identifier *in_super_var = desugarer->id(ss.str());
                    // Re-use in_super since we're replacing it here.
                    superVars.emplace_back(in_super_var, in_super);
                    expr = alloc.make<Var>(expr->location, expr->openFodder, in_super_var);
                }
                CompilerPass::visitExpr(expr);
            }
        };

        SuperVars super_vars;
        unsigned counter = 0;

        // Remove +:
        for (auto &field : fields) {
            if (!field.superSugar)
                continue;
            // We have to bind self/super from expr1 outside the class, as we copy the expression
            // into the field body.
            // Clone it so that we maintain the AST as a tree.
            AST *index = clone(field.expr1);
            // This will remove self/super.
            SubstituteSelfSuper(this, super_vars, counter).expr(index);
            field.expr2 = make<Conditional>(
                ast->location,
                EF,
                make<InSuper>(ast->location, EF, index, EF, EF),
                EF,
                make<Binary>(ast->location,
                             EF,
                             make<SuperIndex>(ast->location, EF, EF, clone(index), EF, nullptr),
                             EF,
                             BOP_PLUS,
                             field.expr2),
                EF,
                clone(field.expr2));
            field.superSugar = false;
        }

        return super_vars;
    }